

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::IStreamingReporter> * __thiscall
Catch::Ptr<Catch::IStreamingReporter>::operator=
          (Ptr<Catch::IStreamingReporter> *this,IStreamingReporter *p)

{
  Ptr<Catch::IStreamingReporter> local_20;
  Ptr<Catch::IStreamingReporter> temp;
  IStreamingReporter *p_local;
  Ptr<Catch::IStreamingReporter> *this_local;
  
  temp.m_p = p;
  Ptr(&local_20,p);
  swap(this,&local_20);
  ~Ptr(&local_20);
  return this;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }